

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void * __thiscall kj::Arena::allocateBytesInternal(Arena *this,size_t amount,uint alignment)

{
  byte *pbVar1;
  void *pvVar2;
  ChunkHeader *pCVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uintptr_t mask;
  ulong uVar7;
  
  pCVar3 = this->currentChunk;
  if (pCVar3 != (ChunkHeader *)0x0) {
    pbVar1 = pCVar3->pos;
    pvVar2 = (void *)(~(ulong)(alignment - 1) & (ulong)(pbVar1 + (alignment - 1)));
    if ((amount - (long)pbVar1) + (long)pvVar2 <= (ulong)((long)pCVar3->end - (long)pbVar1)) {
      pCVar3->pos = (byte *)(amount + (long)pvVar2);
      return pvVar2;
    }
  }
  uVar6 = 8;
  if (8 < alignment) {
    uVar6 = alignment;
  }
  uVar7 = (ulong)(uVar6 - 1);
  uVar5 = (uVar7 + 0x18 & ~uVar7) + amount;
  sVar4 = this->nextChunkSize;
  while (sVar4 < uVar5) {
    sVar4 = sVar4 * 2;
    this->nextChunkSize = sVar4;
  }
  pCVar3 = (ChunkHeader *)operator_new(sVar4);
  pCVar3->next = this->chunkList;
  pCVar3->pos = (byte *)((long)&pCVar3->next + uVar5);
  sVar4 = this->nextChunkSize;
  pCVar3->end = (byte *)((long)&pCVar3->next + sVar4);
  this->currentChunk = pCVar3;
  this->chunkList = pCVar3;
  this->nextChunkSize = sVar4 * 2;
  return (void *)((long)&pCVar3[1].next + uVar7 & ~uVar7);
}

Assistant:

void* Arena::allocateBytesInternal(size_t amount, uint alignment) {
  if (currentChunk != nullptr) {
    ChunkHeader* chunk = currentChunk;
    byte* alignedPos = alignTo(chunk->pos, alignment);

    // Careful about overflow here.
    if (amount + (alignedPos - chunk->pos) <= chunk->end - chunk->pos) {
      // There's enough space in this chunk.
      chunk->pos = alignedPos + amount;
      return alignedPos;
    }
  }

  // Not enough space in the current chunk.  Allocate a new one.

  // We need to allocate at least enough space for the ChunkHeader and the requested allocation.

  // If the alignment is less than that of the chunk header, we'll need to increase it.
  alignment = kj::max(alignment, alignof(ChunkHeader));

  // If the ChunkHeader size does not match the alignment, we'll need to pad it up.
  amount += alignTo(sizeof(ChunkHeader), alignment);

  // Make sure we're going to allocate enough space.
  while (nextChunkSize < amount) {
    nextChunkSize *= 2;
  }

  // Allocate.
  byte* bytes = reinterpret_cast<byte*>(operator new(nextChunkSize));

  // Set up the ChunkHeader at the beginning of the allocation.
  ChunkHeader* newChunk = reinterpret_cast<ChunkHeader*>(bytes);
  newChunk->next = chunkList;
  newChunk->pos = bytes + amount;
  newChunk->end = bytes + nextChunkSize;
  currentChunk = newChunk;
  chunkList = newChunk;
  nextChunkSize *= 2;

  // Move past the ChunkHeader to find the position of the allocated object.
  return alignTo(bytes + sizeof(ChunkHeader), alignment);
}